

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TextureMipmapTests::init(TextureMipmapTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 wrapS;
  TestContext *pTVar1;
  Context *context;
  int iVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  TestNode *node;
  TestNode *pTVar5;
  ostream *poVar6;
  Texture2DMipmapCase *pTVar7;
  RenderContext *pRVar8;
  ContextInfo *pCVar9;
  char *pcVar10;
  Texture2DGenMipmapCase *this_00;
  TestNode *pTVar11;
  TextureCubeMipmapCase *this_01;
  TextureCubeGenMipmapCase *this_02;
  Texture3DMipmapCase *pTVar12;
  long lVar13;
  ulong extraout_RAX;
  ulong uVar14;
  uint local_814;
  int minFilter_16;
  TestCaseGroup *maxLevelGroup_2;
  int minFilter_15;
  TestCaseGroup *baseLevelGroup_2;
  int minFilter_14;
  TestCaseGroup *maxLodGroup_2;
  int minFilter_13;
  TestCaseGroup *minLodGroup_2;
  int minFilter_12;
  TestCaseGroup *biasGroup_1;
  string local_7c0 [32];
  ostringstream local_7a0 [8];
  ostringstream name_3;
  int local_628;
  int size_2;
  int sizeEnd_1;
  int wrapMode_1;
  int minFilter_11;
  TestCaseGroup *coordTypeGroup_2;
  int coordType_2;
  int minFilter_10;
  TestCaseGroup *maxLevelGroup_1;
  int minFilter_9;
  TestCaseGroup *baseLevelGroup_1;
  int minFilter_8;
  TestCaseGroup *maxLodGroup_1;
  int minFilter_7;
  TestCaseGroup *minLodGroup_1;
  string local_5c8 [32];
  ostringstream local_5a8 [8];
  ostringstream name_2;
  int local_430;
  int local_42c;
  int hint_1;
  int format_1;
  TestCaseGroup *genMipmapGroup_1;
  int minFilter_6;
  TestCaseGroup *coordTypeGroup_1;
  int coordType_1;
  int minFilter_5;
  TestCaseGroup *maxLevelGroup;
  int minFilter_4;
  TestCaseGroup *baseLevelGroup;
  int minFilter_3;
  TestCaseGroup *maxLodGroup;
  int minFilter_2;
  TestCaseGroup *minLodGroup;
  string local_3c8 [32];
  ostringstream local_3a8 [8];
  ostringstream name_1;
  int local_22c;
  int local_228;
  int hint;
  int size_1;
  int format;
  TestCaseGroup *genMipmapGroup;
  int minFilter_1;
  TestCaseGroup *biasGroup;
  string local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream name;
  int local_68;
  int size;
  int sizeEnd;
  int wrapMode;
  int minFilter;
  TestCaseGroup *coordTypeGroup;
  int coordType;
  int cubeMapSize;
  TestCaseGroup *group3D;
  TestCaseGroup *groupCube;
  TestCaseGroup *group2D;
  TextureMipmapTests *this_local;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Mipmapping");
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Mipmapping");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"3d",
             "3D Texture Mipmapping");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  tcu::TestNode::addChild((TestNode *)this,node);
  for (coordTypeGroup._0_4_ = 0; (int)coordTypeGroup < 3;
      coordTypeGroup._0_4_ = (int)coordTypeGroup + 1) {
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::coordTypes[(int)coordTypeGroup].name,init::coordTypes[(int)coordTypeGroup].desc
              );
    tcu::TestNode::addChild(pTVar3,pTVar5);
    for (sizeEnd = 0; sizeEnd < 4; sizeEnd = sizeEnd + 1) {
      for (size = 0; size < 3; size = size + 1) {
        iVar2 = 1;
        if (init::coordTypes[(int)coordTypeGroup].type == COORDTYPE_BASIC) {
          iVar2 = 3;
        }
        for (local_68 = 0; local_68 < iVar2; local_68 = local_68 + 1) {
          std::__cxx11::ostringstream::ostringstream(local_1e0);
          poVar6 = std::operator<<((ostream *)local_1e0,init::minFilterModes[sizeEnd].name);
          poVar6 = std::operator<<(poVar6,"_");
          std::operator<<(poVar6,init::wrapModes[size].name);
          if (init::tex2DSizes[local_68].name != (char *)0x0) {
            poVar6 = std::operator<<((ostream *)local_1e0,"_");
            std::operator<<(poVar6,init::tex2DSizes[local_68].name);
          }
          pTVar7 = (Texture2DMipmapCase *)operator_new(0x100);
          pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          pRVar8 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
          pCVar9 = Context::getContextInfo((this->super_TestCaseGroup).m_context);
          std::__cxx11::ostringstream::str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          Texture2DMipmapCase::Texture2DMipmapCase
                    (pTVar7,pTVar1,pRVar8,pCVar9,pcVar10,"",
                     init::coordTypes[(int)coordTypeGroup].type,init::minFilterModes[sizeEnd].mode,
                     init::wrapModes[size].mode,init::wrapModes[size].mode,0x1908,0x1401,
                     init::tex2DSizes[local_68].width,init::tex2DSizes[local_68].height);
          tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar7);
          std::__cxx11::string::~string(local_200);
          std::__cxx11::ostringstream::~ostringstream(local_1e0);
        }
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"bias",
             "User-supplied bias value");
  tcu::TestNode::addChild(pTVar3,pTVar5);
  for (genMipmapGroup._4_4_ = 0; genMipmapGroup._4_4_ < 4;
      genMipmapGroup._4_4_ = genMipmapGroup._4_4_ + 1) {
    pTVar7 = (Texture2DMipmapCase *)operator_new(0x100);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar8 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar9 = Context::getContextInfo((this->super_TestCaseGroup).m_context);
    Texture2DMipmapCase::Texture2DMipmapCase
              (pTVar7,pTVar1,pRVar8,pCVar9,init::minFilterModes[genMipmapGroup._4_4_].name,"",
               COORDTYPE_BASIC_BIAS,init::minFilterModes[genMipmapGroup._4_4_].mode,0x2901,0x2901,
               0x1908,0x1401,0x40,0x40);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar7);
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"generate",
             "Mipmap generation tests");
  tcu::TestNode::addChild(pTVar3,pTVar5);
  for (hint = 0; hint < 8; hint = hint + 1) {
    for (local_228 = 0; local_228 < 3; local_228 = local_228 + 1) {
      for (local_22c = 0; local_22c < 2; local_22c = local_22c + 1) {
        std::__cxx11::ostringstream::ostringstream(local_3a8);
        std::operator<<((ostream *)local_3a8,init::formats[hint].name);
        if (init::tex2DSizes[local_228].name != (char *)0x0) {
          poVar6 = std::operator<<((ostream *)local_3a8,"_");
          std::operator<<(poVar6,init::tex2DSizes[local_228].name);
        }
        poVar6 = std::operator<<((ostream *)local_3a8,"_");
        std::operator<<(poVar6,init::genHints[local_22c].name);
        this_00 = (Texture2DGenMipmapCase *)operator_new(0xf0);
        pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar8 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
        std::__cxx11::ostringstream::str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        Texture2DGenMipmapCase::Texture2DGenMipmapCase
                  (this_00,pTVar1,pRVar8,pcVar10,"",init::formats[hint].format,
                   init::formats[hint].dataType,init::genHints[local_22c].hint,
                   init::tex2DSizes[local_228].width,init::tex2DSizes[local_228].height);
        tcu::TestNode::addChild(pTVar5,(TestNode *)this_00);
        std::__cxx11::string::~string(local_3c8);
        std::__cxx11::ostringstream::~ostringstream(local_3a8);
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"min_lod",
             "Lod control: min lod");
  tcu::TestNode::addChild(pTVar3,pTVar5);
  for (maxLodGroup._4_4_ = 0; maxLodGroup._4_4_ < 4; maxLodGroup._4_4_ = maxLodGroup._4_4_ + 1) {
    pTVar11 = (TestNode *)operator_new(0xe8);
    Texture2DMinLodCase::Texture2DMinLodCase
              ((Texture2DMinLodCase *)pTVar11,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[maxLodGroup._4_4_].name,"",
               init::minFilterModes[maxLodGroup._4_4_].mode);
    tcu::TestNode::addChild(pTVar5,pTVar11);
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"max_lod",
             "Lod control: max lod");
  tcu::TestNode::addChild(pTVar3,pTVar5);
  for (baseLevelGroup._4_4_ = 0; baseLevelGroup._4_4_ < 4;
      baseLevelGroup._4_4_ = baseLevelGroup._4_4_ + 1) {
    pTVar11 = (TestNode *)operator_new(0xe8);
    Texture2DMaxLodCase::Texture2DMaxLodCase
              ((Texture2DMaxLodCase *)pTVar11,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[baseLevelGroup._4_4_].name,"",
               init::minFilterModes[baseLevelGroup._4_4_].mode);
    tcu::TestNode::addChild(pTVar5,pTVar11);
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"base_level",
             "Base level");
  tcu::TestNode::addChild(pTVar3,pTVar5);
  for (maxLevelGroup._4_4_ = 0; maxLevelGroup._4_4_ < 4;
      maxLevelGroup._4_4_ = maxLevelGroup._4_4_ + 1) {
    pTVar11 = (TestNode *)operator_new(0xe8);
    Texture2DBaseLevelCase::Texture2DBaseLevelCase
              ((Texture2DBaseLevelCase *)pTVar11,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[maxLevelGroup._4_4_].name,"",
               init::minFilterModes[maxLevelGroup._4_4_].mode);
    tcu::TestNode::addChild(pTVar5,pTVar11);
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"max_level",
             "Max level");
  tcu::TestNode::addChild(pTVar3,pTVar5);
  for (coordTypeGroup_1._4_4_ = 0; coordTypeGroup_1._4_4_ < 4;
      coordTypeGroup_1._4_4_ = coordTypeGroup_1._4_4_ + 1) {
    pTVar3 = (TestNode *)operator_new(0xe8);
    Texture2DMaxLevelCase::Texture2DMaxLevelCase
              ((Texture2DMaxLevelCase *)pTVar3,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[coordTypeGroup_1._4_4_].name,"",
               init::minFilterModes[coordTypeGroup_1._4_4_].mode);
    tcu::TestNode::addChild(pTVar5,pTVar3);
  }
  for (coordTypeGroup_1._0_4_ = 0; (int)coordTypeGroup_1 < 3;
      coordTypeGroup_1._0_4_ = (int)coordTypeGroup_1 + 1) {
    pTVar3 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::cubeCoordTypes[(int)coordTypeGroup_1].name,
               init::cubeCoordTypes[(int)coordTypeGroup_1].desc);
    tcu::TestNode::addChild(pTVar4,pTVar3);
    for (genMipmapGroup_1._4_4_ = 0; genMipmapGroup_1._4_4_ < 4;
        genMipmapGroup_1._4_4_ = genMipmapGroup_1._4_4_ + 1) {
      this_01 = (TextureCubeMipmapCase *)operator_new(0x100);
      pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar8 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
      pCVar9 = Context::getContextInfo((this->super_TestCaseGroup).m_context);
      TextureCubeMipmapCase::TextureCubeMipmapCase
                (this_01,pTVar1,pRVar8,pCVar9,init::minFilterModes[genMipmapGroup_1._4_4_].name,"",
                 init::cubeCoordTypes[(int)coordTypeGroup_1].type,
                 init::minFilterModes[genMipmapGroup_1._4_4_].mode,0x812f,0x812f,0x1908,0x1401,0x40)
      ;
      tcu::TestNode::addChild(pTVar3,(TestNode *)this_01);
    }
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"generate",
             "Mipmap generation tests");
  tcu::TestNode::addChild(pTVar4,pTVar3);
  for (local_42c = 0; local_42c < 8; local_42c = local_42c + 1) {
    for (local_430 = 0; local_430 < 2; local_430 = local_430 + 1) {
      std::__cxx11::ostringstream::ostringstream(local_5a8);
      poVar6 = std::operator<<((ostream *)local_5a8,init::formats[local_42c].name);
      poVar6 = std::operator<<(poVar6,"_");
      std::operator<<(poVar6,init::genHints[local_430].name);
      this_02 = (TextureCubeGenMipmapCase *)operator_new(0xe8);
      pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar8 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      TextureCubeGenMipmapCase::TextureCubeGenMipmapCase
                (this_02,pTVar1,pRVar8,pcVar10,"",init::formats[local_42c].format,
                 init::formats[local_42c].dataType,init::genHints[local_430].hint,0x40);
      tcu::TestNode::addChild(pTVar3,(TestNode *)this_02);
      std::__cxx11::string::~string(local_5c8);
      std::__cxx11::ostringstream::~ostringstream(local_5a8);
    }
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"min_lod",
             "Lod control: min lod");
  tcu::TestNode::addChild(pTVar4,pTVar3);
  for (maxLodGroup_1._4_4_ = 0; maxLodGroup_1._4_4_ < 4;
      maxLodGroup_1._4_4_ = maxLodGroup_1._4_4_ + 1) {
    pTVar5 = (TestNode *)operator_new(0xe0);
    TextureCubeMinLodCase::TextureCubeMinLodCase
              ((TextureCubeMinLodCase *)pTVar5,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[maxLodGroup_1._4_4_].name,"",
               init::minFilterModes[maxLodGroup_1._4_4_].mode);
    tcu::TestNode::addChild(pTVar3,pTVar5);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"max_lod",
             "Lod control: max lod");
  tcu::TestNode::addChild(pTVar4,pTVar3);
  for (baseLevelGroup_1._4_4_ = 0; baseLevelGroup_1._4_4_ < 4;
      baseLevelGroup_1._4_4_ = baseLevelGroup_1._4_4_ + 1) {
    pTVar5 = (TestNode *)operator_new(0xe0);
    TextureCubeMaxLodCase::TextureCubeMaxLodCase
              ((TextureCubeMaxLodCase *)pTVar5,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[baseLevelGroup_1._4_4_].name,"",
               init::minFilterModes[baseLevelGroup_1._4_4_].mode);
    tcu::TestNode::addChild(pTVar3,pTVar5);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"base_level",
             "Base level");
  tcu::TestNode::addChild(pTVar4,pTVar3);
  for (maxLevelGroup_1._4_4_ = 0; maxLevelGroup_1._4_4_ < 4;
      maxLevelGroup_1._4_4_ = maxLevelGroup_1._4_4_ + 1) {
    pTVar5 = (TestNode *)operator_new(0xe0);
    TextureCubeBaseLevelCase::TextureCubeBaseLevelCase
              ((TextureCubeBaseLevelCase *)pTVar5,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[maxLevelGroup_1._4_4_].name,"",
               init::minFilterModes[maxLevelGroup_1._4_4_].mode);
    tcu::TestNode::addChild(pTVar3,pTVar5);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"max_level",
             "Max level");
  tcu::TestNode::addChild(pTVar4,pTVar3);
  for (coordTypeGroup_2._4_4_ = 0; coordTypeGroup_2._4_4_ < 4;
      coordTypeGroup_2._4_4_ = coordTypeGroup_2._4_4_ + 1) {
    pTVar4 = (TestNode *)operator_new(0xe0);
    TextureCubeMaxLevelCase::TextureCubeMaxLevelCase
              ((TextureCubeMaxLevelCase *)pTVar4,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[coordTypeGroup_2._4_4_].name,"",
               init::minFilterModes[coordTypeGroup_2._4_4_].mode);
    tcu::TestNode::addChild(pTVar3,pTVar4);
  }
  for (coordTypeGroup_2._0_4_ = 0; (int)coordTypeGroup_2 < 3;
      coordTypeGroup_2._0_4_ = (int)coordTypeGroup_2 + 1) {
    pTVar3 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::coordTypes[(int)coordTypeGroup_2].name,
               init::coordTypes[(int)coordTypeGroup_2].desc);
    tcu::TestNode::addChild(node,pTVar3);
    for (sizeEnd_1 = 0; sizeEnd_1 < 4; sizeEnd_1 = sizeEnd_1 + 1) {
      for (size_2 = 0; size_2 < 3; size_2 = size_2 + 1) {
        iVar2 = 1;
        if (init::coordTypes[(int)coordTypeGroup_2].type == COORDTYPE_BASIC) {
          iVar2 = 2;
        }
        for (local_628 = 0; local_628 < iVar2; local_628 = local_628 + 1) {
          std::__cxx11::ostringstream::ostringstream(local_7a0);
          poVar6 = std::operator<<((ostream *)local_7a0,init::minFilterModes[sizeEnd_1].name);
          poVar6 = std::operator<<(poVar6,"_");
          std::operator<<(poVar6,init::wrapModes[size_2].name);
          if (init::tex3DSizes[local_628].name != (char *)0x0) {
            poVar6 = std::operator<<((ostream *)local_7a0,"_");
            std::operator<<(poVar6,init::tex3DSizes[local_628].name);
          }
          pTVar12 = (Texture3DMipmapCase *)operator_new(0x100);
          context = (this->super_TestCaseGroup).m_context;
          std::__cxx11::ostringstream::str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          wrapS = init::wrapModes[size_2].mode;
          lVar13 = (long)local_628;
          Texture3DMipmapCase::Texture3DMipmapCase
                    (pTVar12,context,pcVar10,"",init::coordTypes[(int)coordTypeGroup_2].type,
                     init::minFilterModes[sizeEnd_1].mode,wrapS,wrapS,wrapS,0x8058,
                     init::tex3DSizes[lVar13].width,init::tex3DSizes[lVar13].height,
                     init::tex3DSizes[lVar13].depth);
          tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar12);
          std::__cxx11::string::~string(local_7c0);
          std::__cxx11::ostringstream::~ostringstream(local_7a0);
        }
      }
    }
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"bias",
             "User-supplied bias value");
  tcu::TestNode::addChild(node,pTVar3);
  for (minLodGroup_2._4_4_ = 0; minLodGroup_2._4_4_ < 4;
      minLodGroup_2._4_4_ = minLodGroup_2._4_4_ + 1) {
    pTVar12 = (Texture3DMipmapCase *)operator_new(0x100);
    Texture3DMipmapCase::Texture3DMipmapCase
              (pTVar12,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[minLodGroup_2._4_4_].name,"",COORDTYPE_BASIC_BIAS,
               init::minFilterModes[minLodGroup_2._4_4_].mode,0x2901,0x2901,0x2901,0x8058,0x20,0x20,
               0x20);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar12);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"min_lod",
             "Lod control: min lod");
  tcu::TestNode::addChild(node,pTVar3);
  for (maxLodGroup_2._4_4_ = 0; maxLodGroup_2._4_4_ < 4;
      maxLodGroup_2._4_4_ = maxLodGroup_2._4_4_ + 1) {
    pTVar4 = (TestNode *)operator_new(0xe8);
    Texture3DMinLodCase::Texture3DMinLodCase
              ((Texture3DMinLodCase *)pTVar4,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[maxLodGroup_2._4_4_].name,"",
               init::minFilterModes[maxLodGroup_2._4_4_].mode);
    tcu::TestNode::addChild(pTVar3,pTVar4);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"max_lod",
             "Lod control: max lod");
  tcu::TestNode::addChild(node,pTVar3);
  for (baseLevelGroup_2._4_4_ = 0; baseLevelGroup_2._4_4_ < 4;
      baseLevelGroup_2._4_4_ = baseLevelGroup_2._4_4_ + 1) {
    pTVar4 = (TestNode *)operator_new(0xe8);
    Texture3DMaxLodCase::Texture3DMaxLodCase
              ((Texture3DMaxLodCase *)pTVar4,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[baseLevelGroup_2._4_4_].name,"",
               init::minFilterModes[baseLevelGroup_2._4_4_].mode);
    tcu::TestNode::addChild(pTVar3,pTVar4);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"base_level",
             "Base level");
  tcu::TestNode::addChild(node,pTVar3);
  for (maxLevelGroup_2._4_4_ = 0; maxLevelGroup_2._4_4_ < 4;
      maxLevelGroup_2._4_4_ = maxLevelGroup_2._4_4_ + 1) {
    pTVar4 = (TestNode *)operator_new(0xe8);
    Texture3DBaseLevelCase::Texture3DBaseLevelCase
              ((Texture3DBaseLevelCase *)pTVar4,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[maxLevelGroup_2._4_4_].name,"",
               init::minFilterModes[maxLevelGroup_2._4_4_].mode);
    tcu::TestNode::addChild(pTVar3,pTVar4);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"max_level",
             "Max level");
  tcu::TestNode::addChild(node,pTVar3);
  local_814 = 0;
  uVar14 = extraout_RAX;
  while ((int)local_814 < 4) {
    pTVar4 = (TestNode *)operator_new(0xe8);
    Texture3DMaxLevelCase::Texture3DMaxLevelCase
              ((Texture3DMaxLevelCase *)pTVar4,(this->super_TestCaseGroup).m_context,
               init::minFilterModes[(int)local_814].name,"",
               init::minFilterModes[(int)local_814].mode);
    tcu::TestNode::addChild(pTVar3,pTVar4);
    local_814 = local_814 + 1;
    uVar14 = (ulong)local_814;
  }
  return (int)uVar14;
}

Assistant:

void TextureMipmapTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Mipmapping");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Mipmapping");
	tcu::TestCaseGroup*	group3D		= new tcu::TestCaseGroup(m_testCtx, "3d",	"3D Texture Mipmapping");
	addChild(group2D);
	addChild(groupCube);
	addChild(group3D);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	static const struct
	{
		const char*		name;
		deUint32		hint;
	} genHints[] =
	{
		{ "fastest",	GL_FASTEST },
		{ "nicest",		GL_NICEST }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} tex2DSizes[] =
	{
		{ DE_NULL,		64, 64 }, // Default.
		{ "npot",		63, 57 },
		{ "non_square",	32, 64 }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
		int				depth;
	} tex3DSizes[] =
	{
		{ DE_NULL,		32, 32, 32 }, // Default.
		{ "npot",		33, 29, 27 }
	};

	const int cubeMapSize = 64;

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			},
		{ COORDTYPE_BASIC_BIAS,	"bias",			"User-supplied bias value"							}
	};

	// 2D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group2D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				// Add non_square variants to basic cases only.
				int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex2DSizes) : 1;

				for (int size = 0; size < sizeEnd; size++)
				{
					std::ostringstream name;
					name << minFilterModes[minFilter].name
						 << "_" << wrapModes[wrapMode].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					coordTypeGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
																	 name.str().c_str(), "",
																	 coordTypes[coordType].type,
																	 minFilterModes[minFilter].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 GL_RGBA, GL_UNSIGNED_BYTE,
																	 tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	// 2D bias variants.
	{
		tcu::TestCaseGroup* biasGroup = new tcu::TestCaseGroup(m_testCtx, "bias", "User-supplied bias value");
		group2D->addChild(biasGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			biasGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														minFilterModes[minFilter].name, "",
														COORDTYPE_BASIC_BIAS,
														minFilterModes[minFilter].mode,
														GL_REPEAT, GL_REPEAT,
														GL_RGBA, GL_UNSIGNED_BYTE,
														tex2DSizes[0].width, tex2DSizes[0].height));
	}

	// 2D mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		group2D->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int size = 0; size < DE_LENGTH_OF_ARRAY(tex2DSizes); size++)
			{
				for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
				{
					std::ostringstream name;
					name << formats[format].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					name << "_" << genHints[hint].name;

					genMipmapGroup->addChild(new Texture2DGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
																		formats[format].format, formats[format].dataType, genHints[hint].hint,
																		tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	// 2D LOD controls.
	{
		// MIN_LOD
		tcu::TestCaseGroup* minLodGroup = new tcu::TestCaseGroup(m_testCtx, "min_lod", "Lod control: min lod");
		group2D->addChild(minLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			minLodGroup->addChild(new Texture2DMinLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LOD
		tcu::TestCaseGroup* maxLodGroup = new tcu::TestCaseGroup(m_testCtx, "max_lod", "Lod control: max lod");
		group2D->addChild(maxLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLodGroup->addChild(new Texture2DMaxLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// BASE_LEVEL
		tcu::TestCaseGroup* baseLevelGroup = new tcu::TestCaseGroup(m_testCtx, "base_level", "Base level");
		group2D->addChild(baseLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			baseLevelGroup->addChild(new Texture2DBaseLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LEVEL
		tcu::TestCaseGroup* maxLevelGroup = new tcu::TestCaseGroup(m_testCtx, "max_level", "Max level");
		group2D->addChild(maxLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLevelGroup->addChild(new Texture2DMaxLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));
	}

	// Cubemap cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc);
		groupCube->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			coordTypeGroup->addChild(new TextureCubeMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															   minFilterModes[minFilter].name, "",
															   cubeCoordTypes[coordType].type,
															   minFilterModes[minFilter].mode,
															   GL_CLAMP_TO_EDGE,
															   GL_CLAMP_TO_EDGE,
															   GL_RGBA, GL_UNSIGNED_BYTE, cubeMapSize));
		}
	}

	// Cubemap mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		groupCube->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
			{
				std::ostringstream name;
				name << formats[format].name
					 << "_" << genHints[hint].name;

				genMipmapGroup->addChild(new TextureCubeGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "", formats[format].format, formats[format].dataType, genHints[hint].hint, cubeMapSize));
			}
		}
	}

	// Cubemap LOD controls.
	{
		// MIN_LOD
		tcu::TestCaseGroup* minLodGroup = new tcu::TestCaseGroup(m_testCtx, "min_lod", "Lod control: min lod");
		groupCube->addChild(minLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			minLodGroup->addChild(new TextureCubeMinLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LOD
		tcu::TestCaseGroup* maxLodGroup = new tcu::TestCaseGroup(m_testCtx, "max_lod", "Lod control: max lod");
		groupCube->addChild(maxLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLodGroup->addChild(new TextureCubeMaxLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// BASE_LEVEL
		tcu::TestCaseGroup* baseLevelGroup = new tcu::TestCaseGroup(m_testCtx, "base_level", "Base level");
		groupCube->addChild(baseLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			baseLevelGroup->addChild(new TextureCubeBaseLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LEVEL
		tcu::TestCaseGroup* maxLevelGroup = new tcu::TestCaseGroup(m_testCtx, "max_level", "Max level");
		groupCube->addChild(maxLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLevelGroup->addChild(new TextureCubeMaxLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));
	}

	// 3D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group3D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				// Add other size variants to basic cases only.
				int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex3DSizes) : 1;

				for (int size = 0; size < sizeEnd; size++)
				{
					std::ostringstream name;
					name << minFilterModes[minFilter].name
						 << "_" << wrapModes[wrapMode].name;

					if (tex3DSizes[size].name)
						name << "_" << tex3DSizes[size].name;

					coordTypeGroup->addChild(new Texture3DMipmapCase(m_context,
																	 name.str().c_str(), "",
																	 coordTypes[coordType].type,
																	 minFilterModes[minFilter].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 GL_RGBA8,
																	 tex3DSizes[size].width, tex3DSizes[size].height, tex3DSizes[size].depth));
				}
			}
		}
	}

	// 3D bias variants.
	{
		tcu::TestCaseGroup* biasGroup = new tcu::TestCaseGroup(m_testCtx, "bias", "User-supplied bias value");
		group3D->addChild(biasGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			biasGroup->addChild(new Texture3DMipmapCase(m_context,
														minFilterModes[minFilter].name, "",
														COORDTYPE_BASIC_BIAS,
														minFilterModes[minFilter].mode,
														GL_REPEAT, GL_REPEAT, GL_REPEAT,
														GL_RGBA8,
														tex3DSizes[0].width, tex3DSizes[0].height, tex3DSizes[0].depth));
	}

	// 3D LOD controls.
	{
		// MIN_LOD
		tcu::TestCaseGroup* minLodGroup = new tcu::TestCaseGroup(m_testCtx, "min_lod", "Lod control: min lod");
		group3D->addChild(minLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			minLodGroup->addChild(new Texture3DMinLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LOD
		tcu::TestCaseGroup* maxLodGroup = new tcu::TestCaseGroup(m_testCtx, "max_lod", "Lod control: max lod");
		group3D->addChild(maxLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLodGroup->addChild(new Texture3DMaxLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// BASE_LEVEL
		tcu::TestCaseGroup* baseLevelGroup = new tcu::TestCaseGroup(m_testCtx, "base_level", "Base level");
		group3D->addChild(baseLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			baseLevelGroup->addChild(new Texture3DBaseLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LEVEL
		tcu::TestCaseGroup* maxLevelGroup = new tcu::TestCaseGroup(m_testCtx, "max_level", "Max level");
		group3D->addChild(maxLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLevelGroup->addChild(new Texture3DMaxLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));
	}
}